

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O0

void __thiscall lest::count::~count(count *this)

{
  ostream *poVar1;
  allocator<char> local_51;
  text local_50;
  text local_30;
  count *local_10;
  count *this_local;
  
  local_10 = this;
  poVar1 = (ostream *)std::ostream::operator<<((this->super_action).os,this->n);
  poVar1 = std::operator<<(poVar1," selected ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"test",&local_51);
  pluralise(&local_30,&local_50,this->n);
  poVar1 = std::operator<<(poVar1,(string *)&local_30);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  return;
}

Assistant:

~count()
    {
        os << n << " selected " << pluralise("test", n) << "\n";
    }